

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O0

void Cnf_ManPostprocess_old(Cnf_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_48;
  int local_44;
  int k;
  int i;
  Dar_Cut_t *pCut;
  Dar_Cut_t *pCutBest;
  Aig_Obj_t *pFan;
  Aig_Obj_t *pObj;
  int nVars;
  int nGain;
  int Gain;
  int nNew;
  Cnf_Man_t *p_local;
  
  pObj._4_4_ = 0;
  pObj._0_4_ = 0;
  local_44 = 0;
  do {
    iVar1 = Vec_PtrSize(p->pManAig->vObjs);
    if (iVar1 <= local_44) {
      printf("Total gain = %d.  Vars = %d.\n",(ulong)pObj._4_4_,(ulong)(uint)pObj);
      return;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vObjs,local_44);
    if (((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0)) &&
       ((*(ulong *)&pAVar2->field_0x18 >> 6 & 0x3ffffff) != 0)) {
      for (local_48 = 0; local_48 < (int)(uRam0000000000000004 >> 0x1d); local_48 = local_48 + 1) {
        pAVar2 = Aig_ManObj(p->pManAig,*(int *)((long)local_48 * 4 + 8));
        iVar1 = Aig_ObjIsNode(pAVar2);
        if (iVar1 != 0) {
          if ((*(ulong *)&pAVar2->field_0x18 >> 6 & 0x3ffffff) == 0) {
            __assert_fail("pFan->nRefs != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfPost.c"
                          ,0x42,"void Cnf_ManPostprocess_old(Cnf_Man_t *)");
          }
          if ((((uint)(*(ulong *)&pAVar2->field_0x18 >> 6) & 0x3ffffff) == 1) &&
             (iVar1 = (uRam0000000000000004 >> 0x10 & 0x7ff) +
                      (uRam0000000000000004 >> 0x10 & 0x7ff), iVar1 != 0)) {
            pObj._4_4_ = iVar1 + pObj._4_4_;
            pObj._0_4_ = (uint)pObj + 1;
          }
        }
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cnf_ManPostprocess_old( Cnf_Man_t * p )
{
//    extern int Aig_ManLargeCutEval( Aig_Man_t * p, Aig_Obj_t * pRoot, Dar_Cut_t * pCutR, Dar_Cut_t * pCutL, int Leaf );
    int nNew, Gain, nGain = 0, nVars = 0;

    Aig_Obj_t * pObj, * pFan;
    Dar_Cut_t * pCutBest, * pCut;
    int i, k;//, a, b, Counter;
    Aig_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( pObj->nRefs == 0 )
            continue;
//        pCutBest = Aig_ObjBestCut(pObj);
        pCutBest = NULL;

        Dar_CutForEachLeaf( p->pManAig, pCutBest, pFan, k )
        {
            if ( !Aig_ObjIsNode(pFan) )
                continue;
            assert( pFan->nRefs != 0 );
            if ( pFan->nRefs != 1 )
                continue;
//            pCut = Aig_ObjBestCut(pFan);
            pCut = NULL;
/*
            // find how many common variable they have
            Counter = 0;
            for ( a = 0; a < (int)pCut->nLeaves; a++ )
            {
                for ( b = 0; b < (int)pCutBest->nLeaves; b++ )
                    if ( pCut->pLeaves[a] == pCutBest->pLeaves[b] )
                        break;
                if ( b == (int)pCutBest->nLeaves )
                    continue;
                Counter++;
            }
            printf( "%d ", Counter );
*/
            // find the new truth table after collapsing these two cuts


//            nNew = Aig_ManLargeCutEval( p->pManAig, pObj, pCutBest, pCut, pFan->Id );
            nNew = 0;


//            printf( "%d+%d=%d:%d(%d) ", pCutBest->Cost, pCut->Cost, 
//                pCutBest->Cost+pCut->Cost, nNew, pCutBest->Cost+pCut->Cost-nNew );

            Gain = pCutBest->Value + pCut->Value - nNew;
            if ( Gain > 0 )
            {
                nGain += Gain;
                nVars++;
            }
        }
    }
    printf( "Total gain = %d.  Vars = %d.\n", nGain, nVars );
}